

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutTruth.c
# Opt level: O2

void Cut_TruthCompute(Cut_Man_t *p,Cut_Cut_t *pCut,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1,int fCompl0,
                     int fCompl1)

{
  byte bVar1;
  uint *puVar2;
  uint *puVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar8 = (byte)pCut->field_0x3 & 0xf;
  if (fCompl0 == 0) {
    Extra_TruthCopy(p->puTemp[0],
                    (uint *)(&pCut0[1].field_0x0 + (ulong)((byte)pCut0->field_0x3 & 0xf) * 4),uVar8)
    ;
  }
  else {
    Extra_TruthNot(p->puTemp[0],
                   (uint *)(&pCut0[1].field_0x0 + (ulong)((byte)pCut0->field_0x3 & 0xf) * 4),uVar8);
  }
  puVar2 = p->puTemp[0];
  puVar3 = p->puTemp[2];
  uVar8 = *(uint *)pCut0;
  bVar1 = pCut->field_0x3;
  uVar5 = Cut_TruthPhase(pCut,pCut0);
  Extra_TruthStretch(puVar3,puVar2,uVar8 >> 0x1c,bVar1 & 0xf,uVar5);
  uVar8 = (byte)pCut->field_0x3 & 0xf;
  if (fCompl1 == 0) {
    Extra_TruthCopy(p->puTemp[1],
                    (uint *)(&pCut1[1].field_0x0 + (ulong)((byte)pCut1->field_0x3 & 0xf) * 4),uVar8)
    ;
  }
  else {
    Extra_TruthNot(p->puTemp[1],
                   (uint *)(&pCut1[1].field_0x0 + (ulong)((byte)pCut1->field_0x3 & 0xf) * 4),uVar8);
  }
  puVar2 = p->puTemp[1];
  puVar3 = p->puTemp[3];
  uVar8 = *(uint *)pCut1;
  bVar1 = pCut->field_0x3;
  uVar5 = Cut_TruthPhase(pCut,pCut1);
  Extra_TruthStretch(puVar3,puVar2,uVar8 >> 0x1c,bVar1 & 0xf,uVar5);
  uVar8 = *(uint *)pCut >> 0x18 & 0xf;
  uVar7 = (ulong)(uint)(1 << ((char)uVar8 - 5U & 0x1f));
  if (uVar8 < 6) {
    uVar7 = 1;
  }
  puVar2 = p->puTemp[2];
  puVar3 = p->puTemp[3];
  lVar4 = (ulong)uVar8 * 4 + 0x14;
  if ((*(uint *)pCut >> 0x17 & 1) == 0) {
    for (; 0 < (long)uVar7; uVar7 = uVar7 - 1) {
      *(uint *)((long)&pCut->pNext + uVar7 * 4 + lVar4 + -0x10) =
           puVar3[uVar7 - 1] & puVar2[uVar7 - 1];
    }
  }
  else {
    for (; 0 < (long)uVar7; uVar7 = uVar7 - 1) {
      *(uint *)((long)&pCut->pNext + uVar7 * 4 + lVar4 + -0x10) =
           ~(puVar3[uVar7 - 1] & puVar2[uVar7 - 1]);
    }
  }
  if ((p->pParams->fFancy != 0) &&
     (((undefined1  [24])*pCut & (undefined1  [24])0xf0000000) == (undefined1  [24])0x70000000)) {
    nTotal = nTotal + 1;
    uVar8 = (byte)pCut->field_0x3 & 0xf;
    iVar6 = Extra_TruthMinCofSuppOverlap
                      ((uint *)(&pCut[1].field_0x0 + (ulong)uVar8 * 4),uVar8,(int *)0x0);
    if (iVar6 < 5) {
      nGood = nGood + 1;
    }
  }
  return;
}

Assistant:

void Cut_TruthCompute( Cut_Man_t * p, Cut_Cut_t * pCut, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1, int fCompl0, int fCompl1 )
{
    // permute the first table
    if ( fCompl0 ) 
        Extra_TruthNot( p->puTemp[0], Cut_CutReadTruth(pCut0), pCut->nVarsMax );
    else
        Extra_TruthCopy( p->puTemp[0], Cut_CutReadTruth(pCut0), pCut->nVarsMax );
    Extra_TruthStretch( p->puTemp[2], p->puTemp[0], pCut0->nLeaves, pCut->nVarsMax, Cut_TruthPhase(pCut, pCut0) );
    // permute the second table
    if ( fCompl1 ) 
        Extra_TruthNot( p->puTemp[1], Cut_CutReadTruth(pCut1), pCut->nVarsMax );
    else
        Extra_TruthCopy( p->puTemp[1], Cut_CutReadTruth(pCut1), pCut->nVarsMax );
    Extra_TruthStretch( p->puTemp[3], p->puTemp[1], pCut1->nLeaves, pCut->nVarsMax, Cut_TruthPhase(pCut, pCut1) );
    // produce the resulting table
    if ( pCut->fCompl )
        Extra_TruthNand( Cut_CutReadTruth(pCut), p->puTemp[2], p->puTemp[3], pCut->nVarsMax );
    else
        Extra_TruthAnd( Cut_CutReadTruth(pCut), p->puTemp[2], p->puTemp[3], pCut->nVarsMax );

//    Ivy_TruthTestOne( *Cut_CutReadTruth(pCut) );

    // quit if no fancy computation is needed
    if ( !p->pParams->fFancy )
        return;

    if ( pCut->nLeaves != 7 )
        return;

    // count the total number of truth tables computed
    nTotal++;

    // MAPPING INTO ALTERA 6-2 LOGIC BLOCKS
    // call this procedure to find the minimum number of common variables in the cofactors
    // if this number is less or equal than 3, the cut can be implemented using the 6-2 logic block
    if ( Extra_TruthMinCofSuppOverlap( Cut_CutReadTruth(pCut), pCut->nVarsMax, NULL ) <= 4 )
        nGood++;

    // MAPPING INTO ACTEL 2x2 CELLS
    // call this procedure to see if a semi-canonical form can be found in the lookup table 
    // (if it exists, then a two-level 3-input LUT implementation of the cut exists)
    // Before this procedure is called, cell manager should be defined by calling
    // Cut_CellLoad (make sure file "cells22_daomap_iwls.txt" is available in the working dir)
//    if ( Cut_CellIsRunning() && pCut->nVarsMax <= 9 )
//        nGood += Cut_CellTruthLookup( Cut_CutReadTruth(pCut), pCut->nVarsMax );
}